

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_dft.hpp
# Opt level: O3

void __thiscall SlidingDFT<float,_64UL>::SlidingDFT(SlidingDFT<float,_64UL> *this)

{
  size_t k;
  long lVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  
  this->data_valid = false;
  lVar1 = 0;
  memset(this->x,0,0x100);
  memset(&this->x_index,0,0x608);
  fVar2 = nexttowardf(1.0,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  this->damping_factor = fVar2;
  do {
    fVar2 = cexpf((float)lVar1 * 6.2831855 * 0.015625 * 0.0);
    this->twiddle[lVar1]._M_value = CONCAT44(extraout_XMM0_Db,fVar2);
    this->S[lVar1]._M_value = 0;
    this->x[lVar1] = 0.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x40);
  return;
}

Assistant:

SlidingDFT()
	{
		const std::complex<NumberFormat> j(0.0, 1.0);
		const NumberFormat N = DFT_Length;

		// Compute the twiddle factors, and zero the x and S arrays
		for (size_t k = 0; k < DFT_Length; k++) {
			NumberFormat factor = (NumberFormat)(2.0 * M_PI) * k / N;
			this->twiddle[k] = std::exp(j * factor);
			this->S[k] = 0;
			this->x[k] = 0;
		}
	}